

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::weibull_dist<float>::icdf(weibull_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar2;
  float fVar3;
  result_type_conflict1 rVar4;
  double dVar5;
  undefined4 local_4;
  
  if ((in_XMM0_Da < 0.0) || (1.0 <= in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else {
    rVar2 = param_type::theta(in_RDI);
    fVar3 = math::ln1p(0.0);
    rVar4 = param_type::beta(in_RDI);
    dVar5 = std::pow((double)(ulong)(uint)-fVar3,(double)(ulong)(uint)(1.0 / rVar4));
    local_4 = rVar2 * SUB84(dVar5,0);
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x >= 1) {
#if !(defined __CUDA_ARCH__)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.theta() * math::pow(-math::ln1p(-x), 1 / P.beta());
    }